

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::makeGlobalInitializers
          (TGlslangToSpvTraverser *this,TIntermSequence *initializers)

{
  int iVar1;
  pointer ppTVar2;
  undefined4 extraout_var;
  long lVar4;
  long *plVar3;
  
  (this->builder).buildPoint =
       (this->shaderEntry->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  (this->builder).dirtyLineTracker = true;
  (this->builder).dirtyScopeTracker = true;
  ppTVar2 = (initializers->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(initializers->
                              super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) >> 3)) {
    lVar4 = 0;
    do {
      iVar1 = (*ppTVar2[lVar4]->_vptr_TIntermNode[6])();
      plVar3 = (long *)CONCAT44(extraout_var,iVar1);
      if (((plVar3 != (long *)0x0) && ((int)plVar3[0x17] != 3)) && ((int)plVar3[0x17] != 5)) {
        (**(code **)(*plVar3 + 0x10))(plVar3,this);
      }
      lVar4 = lVar4 + 1;
      ppTVar2 = (initializers->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>)
                .super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(initializers->
                                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                         ).
                                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2)
                          >> 3));
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::makeGlobalInitializers(const glslang::TIntermSequence& initializers)
{
    builder.setBuildPoint(shaderEntry->getLastBlock());
    for (int i = 0; i < (int)initializers.size(); ++i) {
        glslang::TIntermAggregate* initializer = initializers[i]->getAsAggregate();
        if (initializer && initializer->getOp() != glslang::EOpFunction && initializer->getOp() !=
            glslang::EOpLinkerObjects) {

            // We're on a top-level node that's not a function.  Treat as an initializer, whose
            // code goes into the beginning of the entry point.
            initializer->traverse(this);
        }
    }
}